

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabox.hpp
# Opt level: O0

AABox * operator+(AABox *__return_storage_ptr__,AABox *a,point *p)

{
  double dVar1;
  AABox *t;
  point *p_local;
  AABox *a_local;
  
  AABox::AABox(__return_storage_ptr__);
  dVar1 = std::fmin((double)(ulong)(uint)a->x1,(double)(ulong)(uint)p->x);
  __return_storage_ptr__->x1 = SUB84(dVar1,0);
  dVar1 = std::fmax((double)(ulong)(uint)a->x2,(double)(ulong)(uint)p->x);
  __return_storage_ptr__->x2 = SUB84(dVar1,0);
  dVar1 = std::fmin((double)(ulong)(uint)a->y1,(double)(ulong)(uint)p->y);
  __return_storage_ptr__->y1 = SUB84(dVar1,0);
  dVar1 = std::fmax((double)(ulong)(uint)a->y2,(double)(ulong)(uint)p->y);
  __return_storage_ptr__->y2 = SUB84(dVar1,0);
  dVar1 = std::fmin((double)(ulong)(uint)a->z1,(double)(ulong)(uint)p->z);
  __return_storage_ptr__->z1 = SUB84(dVar1,0);
  dVar1 = std::fmax((double)(ulong)(uint)a->z2,(double)(ulong)(uint)p->z);
  __return_storage_ptr__->z2 = SUB84(dVar1,0);
  return __return_storage_ptr__;
}

Assistant:

AABox operator+ (const AABox& a, const point& p) {
	AABox t;
	t.x1 = fmin(a.x1, p.x);
	t.x2 = fmax(a.x2, p.x);
	t.y1 = fmin(a.y1, p.y);
	t.y2 = fmax(a.y2, p.y);
	t.z1 = fmin(a.z1, p.z);
	t.z2 = fmax(a.z2, p.z);
	return t;
}